

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bstrcmp(const_bstring b0,const_bstring b1)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = -0x8000;
  if ((((b1 != (const_bstring)0x0 && b0 != (const_bstring)0x0) &&
       (puVar4 = b0->data, puVar4 != (uchar *)0x0)) && (puVar5 = b1->data, puVar5 != (uchar *)0x0))
     && ((uVar2 = b0->slen, -1 < (int)uVar2 && (uVar3 = b1->slen, -1 < (int)uVar3)))) {
    uVar6 = uVar3;
    if (uVar2 < uVar3) {
      uVar6 = uVar2;
    }
    if ((uVar2 != uVar3) || (iVar7 = 0, uVar2 != 0 && puVar4 != puVar5)) {
      uVar8 = 0;
      do {
        if (uVar6 == uVar8) {
          if (uVar2 <= uVar3) {
            return -(uint)((int)uVar2 < (int)uVar3);
          }
          return 1;
        }
        puVar1 = puVar4 + uVar8;
        iVar7 = (int)(char)*puVar1 - (int)(char)puVar5[uVar8];
        if (iVar7 != 0) {
          return iVar7;
        }
        uVar8 = uVar8 + 1;
        iVar7 = 0;
      } while (*puVar1 != '\0');
    }
  }
  return iVar7;
}

Assistant:

int bstrcmp (const_bstring b0, const_bstring b1) {
int i, v, n;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL ||
		b0->slen < 0 || b1->slen < 0) return SHRT_MIN;
	n = b0->slen; if (n > b1->slen) n = b1->slen;
	if (b0->slen == b1->slen && (b0->data == b1->data || b0->slen == 0))
		return BSTR_OK;

	for (i = 0; i < n; i ++) {
		v = ((char) b0->data[i]) - ((char) b1->data[i]);
		if (v != 0) return v;
		if (b0->data[i] == (unsigned char) '\0') return BSTR_OK;
	}

	if (b0->slen > n) return 1;
	if (b1->slen > n) return -1;
	return BSTR_OK;
}